

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<int&,char_const*&>(String *__return_storage_ptr__,kj *this,int *params,char **params_1)

{
  kj *this_00;
  char **value;
  int *value_00;
  ArrayPtr<const_char> local_48;
  CappedArray<char,_14UL> local_38;
  char **local_20;
  char **params_local_1;
  int *params_local;
  
  local_20 = (char **)params;
  params_local_1 = (char **)this;
  params_local = (int *)__return_storage_ptr__;
  this_00 = (kj *)fwd<int&>((int *)this);
  toCharSequence<int&>(&local_38,this_00,value_00);
  value = fwd<char_const*&>(local_20);
  local_48 = toCharSequence<char_const*&>(value);
  _::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(CappedArray<char,_14UL> *)&local_48,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}